

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

Image * Image_Function_Helper::LookupTable
                  (LookupTableForm4 lookupTable,Image *in,
                  vector<unsigned_char,_std::allocator<unsigned_char>_> *table)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined8 in_RCX;
  ImageTemplate<unsigned_char> *in_RDX;
  code *in_RSI;
  Image *in_RDI;
  Image *out;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Image *this;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffb8;
  undefined2 uVar3;
  
  this = in_RDI;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDX);
  uVar3 = (undefined2)(uVar1 >> 0x10);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDX);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (in_stack_ffffffffffffffb8,(uint32_t)((ulong)this >> 0x20),(uint32_t)this,
             (uint8_t)((ushort)uVar3 >> 8),(uint8_t)uVar3);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(this);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(this);
  (*in_RSI)(in_RDX,0,0,this,0,0,uVar1,uVar2,in_RCX);
  return in_RDI;
}

Assistant:

Image LookupTable( FunctionTable::LookupTableForm4 lookupTable,
                       const Image & in, const std::vector < uint8_t > & table )
    {
        Image_Function::ParameterValidation( in );

        Image out = in.generate( in.width(), in.height() );

        lookupTable( in, 0, 0, out, 0, 0, out.width(), out.height(), table );

        return out;
    }